

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvui.h
# Opt level: O2

int cvui::printf(char *__format,...)

{
  char in_AL;
  int iVar1;
  char *in_RCX;
  int in_EDX;
  int in_ESI;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  allocator<char> local_119;
  String local_118;
  va_list aArgs;
  undefined1 local_d8 [32];
  undefined8 local_b8;
  undefined8 local_b0;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  undefined8 local_38;
  
  aArgs[0].reg_save_area = local_d8;
  if (in_AL != '\0') {
    local_a8 = in_XMM0_Qa;
    local_98 = in_XMM1_Qa;
    local_88 = in_XMM2_Qa;
    local_78 = in_XMM3_Qa;
    local_68 = in_XMM4_Qa;
    local_58 = in_XMM5_Qa;
    local_48 = in_XMM6_Qa;
    local_38 = in_XMM7_Qa;
  }
  aArgs[0].overflow_arg_area = &stack0x00000008;
  aArgs[0].gp_offset = 0x20;
  aArgs[0].fp_offset = 0x30;
  local_b8 = in_R8;
  local_b0 = in_R9;
  vsprintf(internal::gBuffer,in_RCX,aArgs);
  cv::Mat::operator=((Mat *)internal::gScreen,(Mat *)__format);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_118,internal::gBuffer,&local_119);
  internal::text((cvui_block_t *)internal::gScreen,in_ESI,in_EDX,&local_118,0.4,0xcecece,true);
  iVar1 = std::__cxx11::string::~string((string *)&local_118);
  return iVar1;
}

Assistant:

void printf(cv::Mat& theWhere, int theX, int theY, const char *theFmt, ...) {
	va_list aArgs;

	va_start(aArgs, theFmt);
	vsprintf_s(internal::gBuffer, theFmt, aArgs);
	va_end(aArgs);

	internal::gScreen.where = theWhere;
	internal::text(internal::gScreen, theX, theY, internal::gBuffer, 0.4, 0xCECECE, true);
}